

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O1

vec4 ImageCodec::decodeFLOAT_SFIXED5_NV<2>(ImageCodec *param_1,void *ptr)

{
  undefined1 auVar1 [16];
  vec4 vVar2;
  
  auVar1 = pshuflw(ZEXT416(*ptr),ZEXT416(*ptr),0x60);
  vVar2.field_0.field_0.y = (float)(auVar1._4_4_ >> 0x10) * 0.03125;
  vVar2.field_0.field_0.x = (float)(auVar1._0_4_ >> 0x10) * 0.03125;
  vVar2.field_0._8_8_ = 0x3f80000000000000;
  return (vec4)vVar2.field_0;
}

Assistant:

static glm::vec4 decodeFLOAT_SFIXED5_NV(const ImageCodec*, const void* ptr) {
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const int16_t*>(ptr);
        glm::vec4 result(0.f, 0.f, 0.f, 1.f);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = data[i] / 32.f;
        return result;
    }